

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

void glfwGetCursorPos(GLFWwindow *handle,double *xpos,double *ypos)

{
  _GLFWwindow *window;
  undefined1 auStack_48 [8];
  undefined1 auStack_40 [12];
  undefined1 auStack_34 [4];
  undefined1 auStack_30 [4];
  undefined1 auStack_2c [4];
  int iStack_28;
  int iStack_24;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/pc/glfw/src/input.c"
                  ,0x2a6,"void glfwGetCursorPos(GLFWwindow *, double *, double *)");
  }
  if (xpos != (double *)0x0) {
    *xpos = 0.0;
  }
  if (ypos != (double *)0x0) {
    *ypos = 0.0;
  }
  if (_glfw.initialized != 0) {
    if (*(int *)(handle + 0x74) == 0x34003) {
      if (xpos != (double *)0x0) {
        *xpos = *(double *)(handle + 0x1e0);
      }
      if (ypos != (double *)0x0) {
        *ypos = *(double *)(handle + 0x1e8);
      }
      return;
    }
    XQueryPointer(_glfw.x11.display,*(undefined8 *)(handle + 0x348),auStack_48,auStack_40,auStack_34
                  ,auStack_30,&iStack_28,&iStack_24,auStack_2c);
    if (xpos != (double *)0x0) {
      *xpos = (double)iStack_28;
    }
    if (ypos != (double *)0x0) {
      *ypos = (double)iStack_24;
    }
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwGetCursorPos(GLFWwindow* handle, double* xpos, double* ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;

    _GLFW_REQUIRE_INIT();

    if (window->cursorMode == GLFW_CURSOR_DISABLED)
    {
        if (xpos)
            *xpos = window->virtualCursorPosX;
        if (ypos)
            *ypos = window->virtualCursorPosY;
    }
    else
        _glfwPlatformGetCursorPos(window, xpos, ypos);
}